

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

void duckdb::FindMinimalQualification
               (CatalogEntryRetriever *retriever,string *catalog_name,string *schema_name,
               bool *qualify_database,bool *qualify_schema)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  pointer __lhs;
  CatalogSearchEntry *entry;
  pointer pCVar4;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  allocator local_89;
  bool *local_88;
  string local_80;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_60;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_48;
  
  ::std::__cxx11::string::string
            ((string *)&local_80,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_48);
  local_88 = qualify_schema;
  GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_60,retriever,&local_80,
                    schema_name);
  ::std::__cxx11::string::~string((string *)&local_80);
  pCVar4 = local_60.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = local_60.
               super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pCVar4; __lhs = __lhs + 1) {
    _Var1 = ::std::operator==(&__lhs->catalog,catalog_name);
    if (_Var1) {
      _Var1 = ::std::operator==(&__lhs->schema,schema_name);
      if (_Var1) {
        bVar2 = true;
        bVar3 = false;
        goto LAB_016035d3;
      }
    }
  }
  ::std::__cxx11::string::string((string *)&local_80,anon_var_dwarf_3b2a81b + 9,&local_89);
  GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_48,retriever,catalog_name,
                    &local_80);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
  _M_move_assign(&local_60,&local_48);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_48);
  ::std::__cxx11::string::~string((string *)&local_80);
  pCVar4 = local_60.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar3 = true;
    if (pCVar4 == local_60.
                  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
LAB_016035d3:
      *qualify_database = bVar3;
      *local_88 = bVar2;
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
      ~vector(&local_60);
      return;
    }
    _Var1 = ::std::operator==(&pCVar4->catalog,catalog_name);
    if (_Var1) {
      _Var1 = ::std::operator==(&pCVar4->schema,schema_name);
      if (_Var1) {
        bVar2 = false;
        goto LAB_016035d3;
      }
    }
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

void FindMinimalQualification(CatalogEntryRetriever &retriever, const string &catalog_name, const string &schema_name,
                              bool &qualify_database, bool &qualify_schema) {
	// check if we can we qualify ONLY the schema
	bool found = false;
	auto entries = GetCatalogEntries(retriever, INVALID_CATALOG, schema_name);
	for (auto &entry : entries) {
		if (entry.catalog == catalog_name && entry.schema == schema_name) {
			found = true;
			break;
		}
	}
	if (found) {
		qualify_database = false;
		qualify_schema = true;
		return;
	}
	// check if we can qualify ONLY the catalog
	found = false;
	entries = GetCatalogEntries(retriever, catalog_name, INVALID_SCHEMA);
	for (auto &entry : entries) {
		if (entry.catalog == catalog_name && entry.schema == schema_name) {
			found = true;
			break;
		}
	}
	if (found) {
		qualify_database = true;
		qualify_schema = false;
		return;
	}
	// need to qualify both catalog and schema
	qualify_database = true;
	qualify_schema = true;
}